

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

void __thiscall
cs::compiler_type::build_ast
          (compiler_type *this,deque<char,_std::allocator<char>_> *buff,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast,charset encoding)

{
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tmp;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_c0;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_70;
  
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base(&local_c0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base(&local_70);
  translate_into_tokens
            (this,buff,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_c0,
             encoding);
  process_token_buff(this,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_c0,
                     ast);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_70);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_c0);
  return;
}

Assistant:

void build_ast(const std::deque<char> &buff, std::deque<std::deque<token_base *>> &ast,
		               charset encoding = charset::utf8)
		{
			std::deque<token_base *> tokens, tmp;
			translate_into_tokens(buff, tokens, encoding);
			process_token_buff(tokens, ast);
		}